

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O0

void wait_n_cv_ping_pong(ping_pong *pp,int parity)

{
  nsync_time abs_deadline;
  nsync_waitable_s *local_30;
  nsync_waitable_s *pwaitable;
  nsync_waitable_s waitable;
  int parity_local;
  ping_pong *pp_local;
  
  local_30 = (nsync_waitable_s *)&pwaitable;
  pwaitable = (nsync_waitable_s *)(pp->cv + parity);
  waitable.v = &nsync_cv_waitable_funcs;
  waitable.funcs._4_4_ = parity;
  nsync_mu_lock(&pp->mu);
  while (pp->i < pp->limit) {
    while ((pp->i & 1U) == waitable.funcs._4_4_) {
      abs_deadline.tv_nsec = 999999999;
      abs_deadline.tv_sec = 0x7fffffffffffffff;
      nsync_wait_n(pp,nsync_mu_lock,nsync_mu_unlock,abs_deadline,1,&local_30);
    }
    pp->i = pp->i + 1;
    nsync_cv_signal(pp->cv + (int)(1 - waitable.funcs._4_4_));
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void wait_n_cv_ping_pong (ping_pong *pp, int parity) {
	struct nsync_waitable_s waitable;
	struct nsync_waitable_s *pwaitable = &waitable;
	waitable.v = &pp->cv[parity];
	waitable.funcs = &nsync_cv_waitable_funcs;
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_wait_n (&pp->mu, (void (*) (void *)) &nsync_mu_lock,
				      (void (*) (void *)) &nsync_mu_unlock,
				      nsync_time_no_deadline, 1, &pwaitable);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1 - parity]);
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}